

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# liveness.cpp
# Opt level: O3

uint32_t __thiscall
spvtools::opt::analysis::LivenessManager::GetLocOffset
          (LivenessManager *this,uint32_t index,uint32_t agg_type_id)

{
  IRContext *this_00;
  undefined8 *puVar1;
  undefined8 *puVar2;
  int iVar3;
  uint32_t uVar4;
  uint32_t uVar5;
  Type *pTVar6;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  long lVar7;
  bool bVar8;
  
  this_00 = this->ctx_;
  if ((this_00->valid_analyses_ & kAnalysisTypes) == kAnalysisNone) {
    IRContext::BuildTypeManager(this_00);
  }
  pTVar6 = TypeManager::GetType
                     ((this_00->type_mgr_)._M_t.
                      super___uniq_ptr_impl<spvtools::opt::analysis::TypeManager,_std::default_delete<spvtools::opt::analysis::TypeManager>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_spvtools::opt::analysis::TypeManager_*,_std::default_delete<spvtools::opt::analysis::TypeManager>_>
                      .super__Head_base<0UL,_spvtools::opt::analysis::TypeManager_*,_false>.
                      _M_head_impl,agg_type_id);
  iVar3 = (*pTVar6->_vptr_Type[0x18])(pTVar6);
  lVar7 = CONCAT44(extraout_var,iVar3);
  if (lVar7 == 0) {
    iVar3 = (*pTVar6->_vptr_Type[0x1e])(pTVar6);
    lVar7 = CONCAT44(extraout_var_00,iVar3);
    if (lVar7 != 0) {
      puVar1 = *(undefined8 **)(lVar7 + 0x30);
      if (index == 0 || *(undefined8 **)(lVar7 + 0x28) == puVar1) {
        return 0;
      }
      iVar3 = index - 1;
      uVar4 = 0;
      puVar2 = *(undefined8 **)(lVar7 + 0x28);
      do {
        uVar5 = GetLocSize(this,(Type *)*puVar2);
        uVar4 = uVar5 + uVar4;
        bVar8 = iVar3 != 0;
        iVar3 = iVar3 + -1;
        if (puVar2 + 1 == puVar1) {
          return uVar4;
        }
        puVar2 = puVar2 + 1;
      } while (bVar8);
      return uVar4;
    }
    iVar3 = (*pTVar6->_vptr_Type[0x10])(pTVar6);
    lVar7 = CONCAT44(extraout_var_01,iVar3);
    if (lVar7 == 0) {
      iVar3 = (*pTVar6->_vptr_Type[0xe])(pTVar6);
      if (CONCAT44(extraout_var_02,iVar3) == 0) {
        __assert_fail("vec_type && \"unexpected non-aggregate type\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/liveness.cpp"
                      ,0xa5,
                      "uint32_t spvtools::opt::analysis::LivenessManager::GetLocOffset(uint32_t, uint32_t) const"
                     );
      }
      lVar7 = (**(code **)(**(long **)(CONCAT44(extraout_var_02,iVar3) + 0x28) + 0x60))();
      if (((lVar7 != 0) && (1 < index)) && (*(int *)(lVar7 + 0x24) == 0x40)) {
        return 1;
      }
      return 0;
    }
  }
  uVar4 = GetLocSize(this,*(Type **)(lVar7 + 0x28));
  return uVar4 * index;
}

Assistant:

uint32_t LivenessManager::GetLocOffset(uint32_t index,
                                       uint32_t agg_type_id) const {
  analysis::TypeManager* type_mgr = context()->get_type_mgr();
  const analysis::Type* agg_type = type_mgr->GetType(agg_type_id);
  auto arr_type = agg_type->AsArray();
  if (arr_type) return index * GetLocSize(arr_type->element_type());
  auto struct_type = agg_type->AsStruct();
  if (struct_type) {
    uint32_t offset = 0u;
    uint32_t cnt = 0u;
    for (auto& el_type : struct_type->element_types()) {
      if (cnt == index) break;
      offset += GetLocSize(el_type);
      ++cnt;
    }
    return offset;
  }
  auto mat_type = agg_type->AsMatrix();
  if (mat_type) return index * GetLocSize(mat_type->element_type());
  auto vec_type = agg_type->AsVector();
  assert(vec_type && "unexpected non-aggregate type");
  auto comp_type = vec_type->element_type();
  auto flt_type = comp_type->AsFloat();
  if (flt_type && flt_type->width() == 64u && index >= 2u) return 1;
  return 0;
}